

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LArNEST.cpp
# Opt level: O2

LArYieldFluctuationResult * __thiscall
NEST::LArNEST::GetDefaultFluctuations
          (LArYieldFluctuationResult *__return_storage_ptr__,LArNEST *this,LArYieldResult *yields,
          double density)

{
  double dVar1;
  double dVar2;
  RandomGen *pRVar3;
  int64_t iVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double prob;
  
  dVar1 = yields->Nph;
  dVar2 = yields->Nex;
  dVar7 = yields->Nion;
  dVar9 = dVar2 / dVar7;
  prob = 1.0 / (dVar9 + 1.0);
  dVar5 = yields->Ne + dVar1;
  dVar6 = yields->Lindhard;
  pRVar3 = RandomGen::rndm();
  if ((dVar6 != 1.0) || (NAN(dVar6))) {
    dVar6 = dVar5 * 0.1115 * prob;
    if (dVar6 < 0.0) {
      dVar8 = sqrt(dVar6);
    }
    else {
      dVar8 = SQRT(dVar6);
    }
    dVar8 = RandomGen::rand_gauss(pRVar3,dVar5 * prob,dVar8,true);
    dVar8 = floor(dVar8 + 0.5);
    pRVar3 = RandomGen::rndm();
    dVar6 = dVar6 * dVar9;
    if (dVar6 < 0.0) {
      dVar6 = sqrt(dVar6);
    }
    else {
      dVar6 = SQRT(dVar6);
    }
    dVar6 = RandomGen::rand_gauss(pRVar3,dVar5 * prob * dVar9,dVar6,true);
    dVar5 = floor(dVar6 + 0.5);
    dVar6 = 0.0;
    if (0.0 <= dVar5) {
      dVar6 = dVar5;
    }
    dVar5 = 0.0;
    if (0.0 <= dVar8) {
      dVar5 = dVar8;
    }
  }
  else {
    dVar6 = dVar5 * 0.1115;
    if (dVar6 < 0.0) {
      dVar6 = sqrt(dVar6);
    }
    else {
      dVar6 = SQRT(dVar6);
    }
    dVar6 = RandomGen::rand_gauss(pRVar3,dVar5,dVar6,true);
    dVar5 = floor(dVar6 + 0.5);
    dVar6 = 0.0;
    if (0.0 <= dVar5) {
      dVar6 = dVar5;
    }
    pRVar3 = RandomGen::rndm();
    iVar4 = RandomGen::binom_draw(pRVar3,(long)dVar6,prob);
    dVar5 = dVar6;
    if ((double)iVar4 <= dVar6) {
      dVar5 = (double)iVar4;
    }
    dVar6 = dVar6 - dVar5;
  }
  dVar7 = (dVar1 - dVar2) / dVar7;
  __return_storage_ptr__->NphFluctuation = dVar7 * dVar5 + dVar6;
  __return_storage_ptr__->NeFluctuation = (1.0 - dVar7) * dVar5;
  __return_storage_ptr__->NexFluctuation = dVar6;
  __return_storage_ptr__->NionFluctuation = dVar5;
  return __return_storage_ptr__;
}

Assistant:

LArYieldFluctuationResult LArNEST::GetDefaultFluctuations(
    const LArYieldResult &yields, double density) {
  double Fano = 0.1115;
  double NexOverNion = yields.Nex / yields.Nion;
  double p_r = (yields.Nph - yields.Nex) / yields.Nion;
  double alf = 1. / (1. + NexOverNion);
  double Nq = 0;
  double Nex = 0;
  double Nion = 0;
  double Nq_mean = yields.Ne + yields.Nph;
  // If nuclear recoils
  if (yields.Lindhard == 1.) {
    Nq = floor(
        RandomGen::rndm()->rand_gauss(Nq_mean, sqrt(Fano * Nq_mean), true) +
        0.5);
    if (Nq < 0.) {
      Nq = 0.;
    }
    Nion = double(RandomGen::rndm()->binom_draw(Nq, alf));
    if (Nion > Nq) {
      Nion = Nq;
    }
    Nex = Nq - Nion;
    // otherwise
  } else {
    Nion = floor(RandomGen::rndm()->rand_gauss(
                     Nq_mean * alf, sqrt(Fano * Nq_mean * alf), true) +
                 0.5);
    Nex = floor(RandomGen::rndm()->rand_gauss(
                    Nq_mean * alf * NexOverNion,
                    sqrt(Fano * Nq_mean * alf * NexOverNion), true) +
                0.5);
    if (Nex < 0.) {
      Nex = 0.;
    }
    if (Nion < 0.) {
      Nion = 0.;
    }
    Nq = Nion + Nex;
  }
  LArYieldFluctuationResult result{Nex + p_r * Nion, (1. - p_r) * Nion, Nex,
                                   Nion};
  return result;
}